

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int search_new_mv(AV1_COMP *cpi,MACROBLOCK *x,int_mv (*frame_mv) [8],MV_REFERENCE_FRAME ref_frame,
                 int gf_temporal_ref,BLOCK_SIZE bsize,int mi_row,int mi_col,int *rate_mv,
                 RD_STATS *best_rdc)

{
  MV MVar1;
  int iVar2;
  char in_CL;
  long in_RDX;
  MACROBLOCK *in_RSI;
  AV1_COMP *in_RDI;
  int in_R8D;
  BLOCK_SIZE in_R9B;
  MV start_mv;
  FULLPEL_MV start_mv_1;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  int_mv best_mv;
  MV ref_mv;
  int me_search_size_row;
  int me_search_size_col;
  int dis;
  int tmp_sad;
  uint y_sad_zero;
  int_mv *this_ref_frm_newmv;
  AV1_COMMON *cm;
  MB_MODE_INFO *mi;
  MACROBLOCKD *xd;
  undefined3 in_stack_00000114;
  MACROBLOCK *in_stack_00000130;
  AV1_COMP *in_stack_00000138;
  int **mvcost;
  uint *mvjcost;
  MV *ref_mv_00;
  FULLPEL_MV in_stack_fffffffffffffee4;
  MACROBLOCK *in_stack_fffffffffffffee8;
  SUBPEL_FORCE_STOP in_stack_fffffffffffffef8;
  undefined7 in_stack_fffffffffffffef9;
  MV *in_stack_ffffffffffffff00;
  BLOCK_SIZE in_stack_ffffffffffffff0f;
  MACROBLOCK *in_stack_ffffffffffffff10;
  AV1_COMP *in_stack_ffffffffffffff18;
  SUBPEL_MOTION_SEARCH_PARAMS *in_stack_ffffffffffffff20;
  int_mv local_70;
  int_mv local_6c;
  int_mv local_68;
  int local_64;
  int local_60;
  undefined8 local_5c;
  int_mv *local_50;
  AV1_COMMON *local_48;
  MB_MODE_INFO *local_40;
  MACROBLOCKD *local_38;
  BLOCK_SIZE local_29;
  char local_21;
  MACROBLOCK *local_18;
  AV1_COMP *local_10;
  
  local_38 = &in_RSI->e_mbd;
  local_40 = *(in_RSI->e_mbd).mi;
  local_48 = &in_RDI->common;
  local_50 = (int_mv *)(in_RDX + 0x200 + (long)in_CL * 4);
  if (((in_CL < '\x02') || ((in_RDI->oxcf).rc_cfg.mode != AOM_CBR)) || (in_R8D == 0)) {
    iVar2 = combined_motion_search
                      (in_stack_00000138,in_stack_00000130,cpi._7_1_,(int_mv *)x,(int *)frame_mv,
                       CONCAT44(_in_stack_00000114,gf_temporal_ref),(int)rate_mv);
    if (iVar2 == 0) {
      return -1;
    }
  }
  else {
    if (in_R9B < BLOCK_16X16) {
      return -1;
    }
    local_60 = (int)(uint)block_size_wide[in_R9B] >> 1;
    local_64 = (int)(uint)block_size_high[in_R9B] >> 1;
    local_29 = in_R9B;
    local_21 = in_CL;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_6c = av1_get_ref_mv(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    local_68 = local_6c;
    local_5c._4_4_ =
         av1_int_pro_motion_estimation
                   ((AV1_COMP *)ms_params.mv_cost_params.ref_mv,
                    (MACROBLOCK *)ms_params.mv_limits._8_8_,ms_params.mv_limits.col_max._3_1_,
                    ms_params.mv_limits.col_min,ms_params.iters_per_step,(MV *)ms_params.cost_list,
                    (uint *)ms_params.mv_cost_params.mvcost[0],
                    (int)ms_params.mv_cost_params.mvcost[1],ms_params.mv_cost_params.error_per_bit);
    if (local_18->pred_mv_sad[1] < (int)local_5c._4_4_) {
      return -1;
    }
    *local_50 = local_40->mv[0];
    local_70.as_mv.row = local_40->mv[0].as_mv.row;
    local_70.as_mv.col = local_40->mv[0].as_mv.col;
    local_70.as_mv.col = local_70.as_mv.col >> 3;
    local_70.as_mv.row = local_70.as_mv.row >> 3;
    (local_50->as_mv).row = (local_50->as_mv).row >> 3;
    (local_50->as_mv).col = (local_50->as_mv).col >> 3;
    av1_make_default_subpel_ms_params
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff0f,in_stack_ffffffffffffff00,
               (int *)CONCAT71(in_stack_fffffffffffffef9,in_stack_fffffffffffffef8));
    if (((local_10->sf).rt_sf.reduce_mv_pel_precision_highmotion != 0) ||
       ((local_10->sf).rt_sf.reduce_mv_pel_precision_lowcomplex != 0)) {
      memset(&stack0xfffffffffffffee4,0,4);
      subpel_select(local_10,local_18,local_29,&local_70,local_68.as_mv,in_stack_fffffffffffffee4,
                    false);
    }
    MVar1 = get_mv_from_fullmv(&local_70.as_fullmv);
    mvjcost = local_18->pred_sse + local_21;
    mvcost = (int **)&local_5c;
    ref_mv_00 = (MV *)0x0;
    (*(local_10->mv_search_params).find_fractional_mv_step)
              (local_38,local_48,(SUBPEL_MOTION_SEARCH_PARAMS *)&stack0xfffffffffffffee8,MVar1,
               (FULLPEL_MV_STATS *)0x0,&local_70.as_mv,(int *)mvcost,mvjcost,(int_mv *)0x0);
    *local_50 = local_70;
    if (((local_50->as_mv).col == local_68._2_2_) && ((local_50->as_mv).row == local_68._0_2_)) {
      return -1;
    }
    iVar2 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_fffffffffffffee4,MVar1),ref_mv_00,(int *)mvjcost
                            ,mvcost,0);
    *_start_mv = iVar2;
  }
  return 0;
}

Assistant:

static int search_new_mv(AV1_COMP *cpi, MACROBLOCK *x,
                         int_mv frame_mv[][REF_FRAMES],
                         MV_REFERENCE_FRAME ref_frame, int gf_temporal_ref,
                         BLOCK_SIZE bsize, int mi_row, int mi_col, int *rate_mv,
                         RD_STATS *best_rdc) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mi = xd->mi[0];
  AV1_COMMON *cm = &cpi->common;
  int_mv *this_ref_frm_newmv = &frame_mv[NEWMV][ref_frame];
  unsigned int y_sad_zero;
  if (ref_frame > LAST_FRAME && cpi->oxcf.rc_cfg.mode == AOM_CBR &&
      gf_temporal_ref) {
    int tmp_sad;
    int dis;

    if (bsize < BLOCK_16X16) return -1;

    int me_search_size_col = block_size_wide[bsize] >> 1;
    int me_search_size_row = block_size_high[bsize] >> 1;
    MV ref_mv = av1_get_ref_mv(x, 0).as_mv;
    tmp_sad = av1_int_pro_motion_estimation(
        cpi, x, bsize, mi_row, mi_col, &ref_mv, &y_sad_zero, me_search_size_col,
        me_search_size_row);

    if (tmp_sad > x->pred_mv_sad[LAST_FRAME]) return -1;

    this_ref_frm_newmv->as_int = mi->mv[0].as_int;
    int_mv best_mv = mi->mv[0];
    best_mv.as_mv.row >>= 3;
    best_mv.as_mv.col >>= 3;
    this_ref_frm_newmv->as_mv.row >>= 3;
    this_ref_frm_newmv->as_mv.col >>= 3;

    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv, NULL);
    if (cpi->sf.rt_sf.reduce_mv_pel_precision_highmotion ||
        cpi->sf.rt_sf.reduce_mv_pel_precision_lowcomplex) {
      FULLPEL_MV start_mv = { .row = 0, .col = 0 };
      ms_params.forced_stop =
          subpel_select(cpi, x, bsize, &best_mv, ref_mv, start_mv, false);
    }
    MV start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, start_mv));
    cpi->mv_search_params.find_fractional_mv_step(
        xd, cm, &ms_params, start_mv, NULL, &best_mv.as_mv, &dis,
        &x->pred_sse[ref_frame], NULL);
    this_ref_frm_newmv->as_int = best_mv.as_int;

    // When NEWMV is same as ref_mv from the drl, it is preferred to code the
    // MV as NEARESTMV or NEARMV. In this case, NEWMV needs to be skipped to
    // avoid an assert failure at a later stage. The scenario can occur if
    // NEARESTMV was not evaluated for ALTREF.
    if (this_ref_frm_newmv->as_mv.col == ref_mv.col &&
        this_ref_frm_newmv->as_mv.row == ref_mv.row)
      return -1;

    *rate_mv = av1_mv_bit_cost(&this_ref_frm_newmv->as_mv, &ref_mv,
                               x->mv_costs->nmv_joint_cost,
                               x->mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  } else if (!combined_motion_search(cpi, x, bsize, &frame_mv[NEWMV][ref_frame],
                                     rate_mv, best_rdc->rdcost, 0)) {
    return -1;
  }

  return 0;
}